

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderConstantVariables.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderConstantVariables::iterate(GeometryShaderConstantVariables *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_1888;
  ApiType local_1704;
  MessageBuilder local_1700;
  int local_1580;
  int local_157c;
  GLint n_max_combined_geometry_uniform_components;
  GLint n_max_geometry_uniform_components;
  GLint n_max_geometry_uniform_block_size;
  GLint n_max_geometry_uniform_blocks;
  MessageBuilder local_13f0;
  MessageBuilder local_1270;
  MessageBuilder local_10f0;
  MessageBuilder local_f70;
  MessageBuilder local_df0;
  MessageBuilder local_c70;
  MessageBuilder local_af0;
  MessageBuilder local_970;
  MessageBuilder local_7f0;
  MessageBuilder local_670;
  MessageBuilder local_4f0;
  MessageBuilder local_370;
  GLenum local_1f0 [2];
  GLint int_value;
  MessageBuilder local_1e0;
  uint local_60;
  byte local_59;
  uint id;
  bool has_failed;
  GLint *stored_data_ptr;
  int local_48;
  uint index;
  GLint constant_values [9];
  uint n_varyings;
  Functions *gl;
  GeometryShaderConstantVariables *this_local;
  
  initTest(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar2);
  (**(code **)(register0x00000000 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"Could not bind a vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc0);
  (**(code **)(stack0xffffffffffffffe0 + 0x40))(0x8892,this->m_bo_id);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"Could not bind a buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc3);
  (**(code **)(stack0xffffffffffffffe0 + 0x48))(0x8c8e,0,this->m_bo_id);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"Could not bind buffer object to transform feedback binding point.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xc6);
  (**(code **)(stack0xffffffffffffffe0 + 0x1680))(this->m_program_id);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xca);
  (**(code **)(stack0xffffffffffffffe0 + 0x5e0))(0x8c89);
  (**(code **)(stack0xffffffffffffffe0 + 0x30))(0);
  (**(code **)(stack0xffffffffffffffe0 + 0x538))(0,0,1);
  (**(code **)(stack0xffffffffffffffe0 + 0x638))();
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"Rendering failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xd4);
  (**(code **)(stack0xffffffffffffffe0 + 0x4e8))(0x8c89);
  constant_values[7] = 9;
  memset(&local_48,0,0x24);
  stored_data_ptr._4_4_ = 0;
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,&local_48);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xdf);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xe3);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xe7);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xeb);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xef);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xf3);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xf7);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xfb);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS,
             &local_48 + stored_data_ptr._4_4_);
  stored_data_ptr._4_4_ = stored_data_ptr._4_4_ + 1;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0xff);
  _id = (**(code **)(stack0xffffffffffffffe0 + 0xd00))(0x8c8e,0,0x24,1);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"Could not map buffer object storage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x104);
  local_59 = 0;
  for (local_60 = 0; local_60 < 9; local_60 = local_60 + 1) {
    if ((&local_48)[local_60] != *(int *)(_id + (ulong)local_60 * 4)) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1e0,(char (*) [33])"Values reported for ES constant ");
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char **)(m_feedbackVaryings + (ulong)local_60 * 8));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" in a shader: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)(_id + (ulong)local_60 * 4));
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [34])" and via a glGetIntegerv() call: ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_48 + local_60);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])0x29b68c5);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e0);
      local_59 = 1;
    }
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x1670))(0x8c8e);
  local_1f0[0] = 0;
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,local_1f0)
  ;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x120);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryAtomicCounterBuffers) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_370,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_370,
                        (char (*) [68])
                        "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryAtomicCounterBuffers);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_370);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x12e);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryAtomicCounters) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4f0,
                        (char (*) [61])
                        "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryAtomicCounters);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f0);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x13c);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryImagesUniforms) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_670,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_670,
                        (char (*) [60])"Reported GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT constant value "
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryImagesUniforms);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_670);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x149);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryTextureImagesUnits) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_7f0,
                        (char (*) [65])
                        "Reported GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryTextureImagesUnits);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7f0);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x158);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryShaderStorageBlocks) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_970,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_970,
                        (char (*) [67])
                        "Reported GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryShaderStorageBlocks);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_970);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x166);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryUniformComponents) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_af0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_af0,
                        (char (*) [64])
                        "Reported GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryUniformComponents);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_af0);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x174);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryUniformBlocks) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_c70,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_c70,
                        (char (*) [60])"Reported GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT constant value "
                       );
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryUniformBlocks);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c70);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x181);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryInputComponents) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_df0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_df0,
                        (char (*) [62])
                        "Reported GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryInputComponents);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_df0);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x18e);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryOutputComponents) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_f70,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_f70,
                        (char (*) [63])
                        "Reported GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryOutputComponents);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_f70);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x19b);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryOutputVertices) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_10f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_10f0,
                        (char (*) [61])
                        "Reported GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryOutputVertices);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_10f0);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,local_1f0
            );
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1a8);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryTotalOutputComponents) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1270,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1270,
                        (char (*) [69])
                        "Reported GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryTotalOutputComponents);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1270);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1b6);
  if ((int)local_1f0[0] < this->m_min_MaxGeometryShaderInvocations) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_13f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_13f0,
                        (char (*) [64])
                        "Reported GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxGeometryShaderInvocations);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_13f0);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_FRAMEBUFFER_LAYERS,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_FRAMEBUFFER_LAYERS_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1c3);
  if ((int)local_1f0[0] < this->m_min_MaxFramebufferLayers) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&n_max_geometry_uniform_block_size,pTVar5,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&n_max_geometry_uniform_block_size,
                        (char (*) [55])"Reported GL_MAX_FRAMEBUFFER_LAYERS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_min_MaxFramebufferLayers);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&n_max_geometry_uniform_block_size);
    local_59 = 1;
  }
  n_max_geometry_uniform_components = 0;
  n_max_combined_geometry_uniform_components = 0;
  local_157c = 0;
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS,
             &n_max_geometry_uniform_components);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1d5);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))(0x8a30,&n_max_combined_geometry_uniform_components)
  ;
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_UNIFORM_BLOCK_SIZE.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1d9);
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS,&local_157c);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1dd);
  local_1580 = (n_max_geometry_uniform_components * n_max_combined_geometry_uniform_components) / 4
               + local_157c;
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS,
             local_1f0,
             (long)(n_max_geometry_uniform_components * n_max_combined_geometry_uniform_components)
             % 4 & 0xffffffff);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,
                  "glGetIntegerv() failed for GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,0x1e5);
  if ((int)local_1f0[0] < local_1580) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1700,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1700,
                        (char (*) [73])
                        "Reported GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [44])" is smaller than required minimum value of ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1580);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1700);
    local_59 = 1;
  }
  (**(code **)(stack0xffffffffffffffe0 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.LAYER_PROVOKING_VERTEX,local_1f0);
  dVar3 = (**(code **)(stack0xffffffffffffffe0 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderConstantVariables.cpp"
                  ,500);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_1704.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)local_1704.m_bits);
  if ((((!bVar1) && (local_1f0[0] != 0x8e4f)) &&
      (local_1f0[0] != (this->super_TestCaseBase).m_glExtTokens.FIRST_VERTEX_CONVENTION)) &&
     ((local_1f0[0] != (this->super_TestCaseBase).m_glExtTokens.LAST_VERTEX_CONVENTION &&
      (local_1f0[0] != (this->super_TestCaseBase).m_glExtTokens.UNDEFINED_VERTEX)))) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1888,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1888,
                        (char (*) [55])"Reported GL_LAYER_PROVOKING_VERTEX_EXT constant value ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [33])" is not among permissible values");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1888);
    local_59 = 1;
  }
  if ((local_59 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderConstantVariables::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up relevant bindings */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a vertex array object");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a buffer object!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object to transform feedback binding point.");

	/* Prepare for rendering. */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	gl.enable(GL_RASTERIZER_DISCARD);

	gl.beginTransformFeedback(GL_POINTS);
	{
		/* Render */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed.");

	gl.disable(GL_RASTERIZER_DISCARD);

	/* First, retrieve the ES constant values using the API. */
	const unsigned int n_varyings				   = sizeof(m_feedbackVaryings) / sizeof(m_feedbackVaryings[0]);
	glw::GLint		   constant_values[n_varyings] = { 0 };
	unsigned int	   index					   = 0;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT failed.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS, &constant_values[index]);
	index++;
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT failed.");

	const glw::GLint* stored_data_ptr = (const glw::GLint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(glw::GLint) * n_varyings, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map buffer object storage");

	/* Compare the values that were stored by the draw call with values
	 * returned by the getter call.
	 */
	bool has_failed = false;
	for (unsigned int id = 0; id < n_varyings; ++id)
	{
		if (constant_values[id] != stored_data_ptr[id])
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Values reported for ES constant " << m_feedbackVaryings[id]
							   << " in a shader: " << stored_data_ptr[id]
							   << " and via a glGetIntegerv() call: " << constant_values[id] << " do not match."
							   << tcu::TestLog::EndMessage;
			has_failed = true;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	/* Check whether the reported values are at least of the minimum value described in relevant
	 * extension specifications */

	glw::GLint int_value = 0;

	/* Check values of ES constants specific to shader atomic counters */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT");

	if (int_value < m_min_MaxGeometryAtomicCounterBuffers)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryAtomicCounterBuffers
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT");

	if (int_value < m_min_MaxGeometryAtomicCounters)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryAtomicCounters << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check values of ES constants specific to image load store */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_IMAGE_UNIFORMS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT");

	if (int_value < m_min_MaxGeometryImagesUniforms)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryImagesUniforms << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT");

	if (int_value < m_min_MaxGeometryTextureImagesUnits)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryTextureImagesUnits
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check values of ES constants specific to shader storage buffer objects */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT");

	if (int_value < m_min_MaxGeometryShaderStorageBlocks)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryShaderStorageBlocks
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryUniformComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryUniformComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Check EXT_geometry_shader specific constant values */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT");

	if (int_value < m_min_MaxGeometryUniformBlocks)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryUniformBlocks << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_INPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryInputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryInputComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryOutputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryOutputComponents << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_OUTPUT_VERTICES, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT");

	if (int_value < m_min_MaxGeometryOutputVertices)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryOutputVertices << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT");

	if (int_value < m_min_MaxGeometryTotalOutputComponents)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT constant value " << int_value
						   << " is smaller than required minimum value of " << m_min_MaxGeometryTotalOutputComponents
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_INVOCATIONS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT");

	if (int_value < m_min_MaxGeometryShaderInvocations)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT constant value "
						   << int_value << " is smaller than required minimum value of "
						   << m_min_MaxGeometryShaderInvocations << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	gl.getIntegerv(m_glExtTokens.MAX_FRAMEBUFFER_LAYERS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_FRAMEBUFFER_LAYERS_EXT");

	if (int_value < m_min_MaxFramebufferLayers)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_MAX_FRAMEBUFFER_LAYERS_EXT constant value "
						   << int_value << " is smaller than required minimum value of " << m_min_MaxFramebufferLayers
						   << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Compute minimum value that is acceptable for gl_MaxCombinedGeometryUniformComponents */
	glw::GLint n_max_geometry_uniform_blocks	 = 0;
	glw::GLint n_max_geometry_uniform_block_size = 0;
	glw::GLint n_max_geometry_uniform_components = 0;

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_BLOCKS, &n_max_geometry_uniform_blocks);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT.");

	gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &n_max_geometry_uniform_block_size);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_UNIFORM_BLOCK_SIZE.");

	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_UNIFORM_COMPONENTS, &n_max_geometry_uniform_components);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT.");

	glw::GLint n_max_combined_geometry_uniform_components =
		n_max_geometry_uniform_blocks * n_max_geometry_uniform_block_size / 4 + n_max_geometry_uniform_components;

	/* Compare against actual constant value */
	gl.getIntegerv(m_glExtTokens.MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT.");

	if (int_value < n_max_combined_geometry_uniform_components)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Reported GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT constant value " << int_value
						   << " is smaller than required minimum value of "
						   << n_max_combined_geometry_uniform_components << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	/* Make sure value reported for GL_LAYER_PROVOKING_VERTEX_EXT is valid */
	gl.getIntegerv(m_glExtTokens.LAYER_PROVOKING_VERTEX, &int_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT.");

	if (
		/* This value is allowed in Desktop OpenGL, but not in the ES 3.1 extension. */
		(!glu::isContextTypeES(m_context.getRenderContext().getType()) &&
		 (glw::GLenum)int_value != GL_PROVOKING_VERTEX) &&
		(glw::GLenum)int_value != m_glExtTokens.FIRST_VERTEX_CONVENTION &&
		(glw::GLenum)int_value != m_glExtTokens.LAST_VERTEX_CONVENTION &&
		(glw::GLenum)int_value != m_glExtTokens.UNDEFINED_VERTEX)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Reported GL_LAYER_PROVOKING_VERTEX_EXT constant value "
						   << int_value << " is not among permissible values" << tcu::TestLog::EndMessage;

		has_failed = true;
	}

	if (has_failed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}